

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void AccumulateRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int rgb_stride,
                   uint16_t *dst,int width)

{
  short sVar1;
  undefined2 uVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined2 *in_R9;
  uint in_stack_00000008;
  int b_1;
  int g_1;
  int r_1;
  uint32_t a_1;
  int b;
  int g;
  int r;
  uint32_t a;
  int j;
  int i;
  int in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 uVar8;
  undefined4 in_stack_ffffffffffffffac;
  undefined2 uVar9;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 uVar10;
  undefined4 in_stack_ffffffffffffffb4;
  undefined2 local_48;
  undefined2 local_44;
  undefined2 local_40;
  int local_38;
  int local_34;
  undefined2 *local_30;
  
  local_38 = 0;
  local_30 = in_R9;
  for (local_34 = 0; local_34 < (int)in_stack_00000008 >> 1; local_34 = local_34 + 1) {
    sVar1 = (ushort)*(byte *)(in_RCX + local_38) +
            (ushort)*(byte *)(in_RCX + local_38 + (long)in_R8D) +
            (ushort)*(byte *)(in_RCX + 4 + (long)local_38) +
            (ushort)*(byte *)(in_RCX + local_38 + 4 + (long)in_R8D);
    if ((sVar1 == 0x3fc) || (sVar1 == 0)) {
      in_stack_ffffffffffffff84 = GammaToLinear(*(uint8_t *)(in_RDI + local_38));
      GammaToLinear(*(uint8_t *)(in_RDI + 4 + (long)local_38));
      GammaToLinear(*(uint8_t *)(in_RDI + local_38 + (long)in_R8D));
      GammaToLinear(*(uint8_t *)(in_RDI + local_38 + (long)(in_R8D + 4)));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      local_40 = (undefined2)iVar3;
      GammaToLinear(*(uint8_t *)(in_RSI + local_38));
      GammaToLinear(*(uint8_t *)(in_RSI + 4 + (long)local_38));
      GammaToLinear(*(uint8_t *)(in_RSI + local_38 + (long)in_R8D));
      GammaToLinear(*(uint8_t *)(in_RSI + local_38 + (long)(in_R8D + 4)));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      local_44 = (undefined2)iVar3;
      in_stack_ffffffffffffff9c = GammaToLinear(*(uint8_t *)(in_RDX + local_38));
      uVar4 = GammaToLinear(*(uint8_t *)(in_RDX + 4 + (long)local_38));
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff9c + uVar4;
      uVar4 = GammaToLinear(*(uint8_t *)(in_RDX + local_38 + (long)in_R8D));
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa0 + uVar4;
      GammaToLinear(*(uint8_t *)(in_RDX + local_38 + (long)(in_R8D + 4)));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      local_48 = (undefined2)iVar3;
    }
    else {
      iVar3 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      local_40 = (undefined2)iVar3;
      iVar3 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      local_44 = (undefined2)iVar3;
      iVar3 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      local_48 = (undefined2)iVar3;
    }
    *local_30 = local_40;
    local_30[1] = local_44;
    local_30[2] = local_48;
    local_30[3] = sVar1;
    local_38 = local_38 + 8;
    local_30 = local_30 + 4;
  }
  if ((in_stack_00000008 & 1) != 0) {
    iVar3 = (uint)*(byte *)(in_RCX + local_38) + (uint)*(byte *)(in_RCX + local_38 + (long)in_R8D);
    iVar5 = iVar3 * 2;
    if ((iVar3 == 0x1fe) || (iVar3 == 0)) {
      GammaToLinear(*(uint8_t *)(in_RDI + local_38));
      uVar10 = (undefined2)iVar5;
      GammaToLinear(*(uint8_t *)(in_RDI + local_38 + (long)in_R8D));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      uVar9 = (undefined2)iVar3;
      GammaToLinear(*(uint8_t *)(in_RSI + local_38));
      GammaToLinear(*(uint8_t *)(in_RSI + local_38 + (long)in_R8D));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      uVar8 = (undefined2)iVar3;
      uVar4 = GammaToLinear(*(uint8_t *)(in_RDX + local_38));
      GammaToLinear(*(uint8_t *)(in_RDX + local_38 + (long)in_R8D));
      iVar3 = LinearToGamma(in_stack_ffffffffffffff84,uVar4);
      uVar2 = (undefined2)iVar3;
    }
    else {
      iVar3 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      iVar6 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(iVar5,iVar3),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      iVar7 = LinearToGammaWeighted
                        ((uint8_t *)CONCAT44(iVar5,iVar3),
                         (uint8_t *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
      uVar10 = (undefined2)iVar5;
      uVar8 = (undefined2)iVar6;
      uVar9 = (undefined2)iVar3;
      uVar2 = (undefined2)iVar7;
    }
    *local_30 = uVar9;
    local_30[1] = uVar8;
    local_30[2] = uVar2;
    local_30[3] = uVar10;
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGBA(const uint8_t* const r_ptr,
                                       const uint8_t* const g_ptr,
                                       const uint8_t* const b_ptr,
                                       const uint8_t* const a_ptr,
                                       int rgb_stride,
                                       uint16_t* dst, int width) {
  int i, j;
  // we loop over 2x2 blocks and produce one R/G/B/A value for each.
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * 4, dst += 4) {
    const uint32_t a = SUM4ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM4(r_ptr + j, 4);
      g = SUM4(g_ptr + j, 4);
      b = SUM4(b_ptr + j, 4);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 4, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 4, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 4, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
  if (width & 1) {
    const uint32_t a = 2u * SUM2ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM2(r_ptr + j);
      g = SUM2(g_ptr + j);
      b = SUM2(b_ptr + j);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 0, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 0, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 0, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
}